

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O0

void __thiscall
kj::TlsConnectionReceiver::onAcceptSuccess(TlsConnectionReceiver *this,AuthenticatedStream *stream)

{
  Promise<void> *promise;
  Promise<kj::AuthenticatedStream> local_38;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:575:42),_kj::AuthenticatedStream>
  sslPromise;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:570:38),_void>
  acceptPromise;
  AuthenticatedStream *stream_local;
  TlsConnectionReceiver *this_local;
  
  sslPromise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  acceptPromise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)stream;
  evalNow<kj::TlsConnectionReceiver::onAcceptSuccess(kj::AuthenticatedStream&&)::_lambda()_1_>
            ((kj *)&stack0xffffffffffffffe0,(anon_class_16_2_53b01f7b *)&sslPromise);
  Promise<kj::AuthenticatedStream>::
  then<kj::TlsConnectionReceiver::onAcceptSuccess(kj::AuthenticatedStream&&)::_lambda(auto:1&&)_1_>
            (&local_38,(Type *)&stack0xffffffffffffffe0);
  promise = mv<kj::Promise<void>>((Promise<void> *)&local_38);
  TaskSet::add(&this->tasks,promise);
  Promise<void>::~Promise((Promise<void> *)&local_38);
  Promise<kj::AuthenticatedStream>::~Promise
            ((Promise<kj::AuthenticatedStream> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void onAcceptSuccess(AuthenticatedStream&& stream) {
    // Queue this stream to go through SSL_accept.

    auto acceptPromise = kj::evalNow([&] {
      // Do the SSL acceptance procedure.
      return tls.wrapServer(kj::mv(stream));
    });

    auto sslPromise = acceptPromise.then([this](auto&& stream) -> Promise<void> {
      // This is only attached to the success path, thus the error handler will catch if our
      // promise fails.
      queue.push(kj::mv(stream));
      return kj::READY_NOW;
    });
    tasks.add(kj::mv(sslPromise));
  }